

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O0

void forward_DCT(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY sample_data,
                JBLOCKROW coef_blocks,JDIMENSION start_row,JDIMENSION start_col,
                JDIMENSION num_blocks)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  JCOEFPTR output_ptr;
  int i;
  DCTELEM qval;
  DCTELEM temp;
  JDIMENSION bi;
  DCTELEM workspace [64];
  DCTELEM *divisors;
  forward_DCT_method_ptr do_dct;
  my_fdct_ptr fdct;
  int local_158;
  short local_150;
  uint local_14c;
  int local_148 [66];
  long local_40;
  code *local_38;
  long local_30;
  int local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_30 = *(long *)(in_RDI + 0x228);
  local_38 = *(code **)(local_30 + 0x58 + (long)*(int *)(in_RSI + 4) * 8);
  local_40 = *(long *)(local_30 + 0xa8 + (long)*(int *)(in_RSI + 0x10) * 8);
  local_18 = in_RDX + (ulong)in_R8D * 8;
  local_28 = in_R9D;
  local_20 = in_RCX;
  local_10 = in_RSI;
  for (local_14c = 0; local_14c < (uint)output_ptr; local_14c = local_14c + 1) {
    (*local_38)(local_148,local_18,local_28);
    for (local_158 = 0; local_158 < 0x40; local_158 = local_158 + 1) {
      iVar1 = *(int *)(local_40 + (long)local_158 * 4);
      iVar2 = local_148[local_158];
      if (iVar2 < 0) {
        iVar2 = (iVar1 >> 1) - iVar2;
        if (iVar2 < iVar1) {
          local_150 = 0;
        }
        else {
          local_150 = (short)(iVar2 / iVar1);
        }
        local_150 = -local_150;
      }
      else {
        iVar2 = (iVar1 >> 1) + iVar2;
        if (iVar2 < iVar1) {
          local_150 = 0;
        }
        else {
          local_150 = (short)(iVar2 / iVar1);
        }
      }
      *(short *)(local_20 + (ulong)local_14c * 0x80 + (long)local_158 * 2) = local_150;
    }
    local_28 = *(int *)(local_10 + 0x24) + local_28;
  }
  return;
}

Assistant:

METHODDEF(void)
forward_DCT (j_compress_ptr cinfo, jpeg_component_info * compptr,
	     JSAMPARRAY sample_data, JBLOCKROW coef_blocks,
	     JDIMENSION start_row, JDIMENSION start_col,
	     JDIMENSION num_blocks)
/* This version is used for integer DCT implementations. */
{
  /* This routine is heavily used, so it's worth coding it tightly. */
  my_fdct_ptr fdct = (my_fdct_ptr) cinfo->fdct;
  forward_DCT_method_ptr do_dct = fdct->do_dct[compptr->component_index];
  DCTELEM * divisors = fdct->divisors[compptr->quant_tbl_no];
  DCTELEM workspace[DCTSIZE2];	/* work area for FDCT subroutine */
  JDIMENSION bi;

  sample_data += start_row;	/* fold in the vertical offset once */

  for (bi = 0; bi < num_blocks; bi++, start_col += compptr->DCT_h_scaled_size) {
    /* Perform the DCT */
    (*do_dct) (workspace, sample_data, start_col);

    /* Quantize/descale the coefficients, and store into coef_blocks[] */
    { register DCTELEM temp, qval;
      register int i;
      register JCOEFPTR output_ptr = coef_blocks[bi];

      for (i = 0; i < DCTSIZE2; i++) {
	qval = divisors[i];
	temp = workspace[i];
	/* Divide the coefficient value by qval, ensuring proper rounding.
	 * Since C does not specify the direction of rounding for negative
	 * quotients, we have to force the dividend positive for portability.
	 *
	 * In most files, at least half of the output values will be zero
	 * (at default quantization settings, more like three-quarters...)
	 * so we should ensure that this case is fast.  On many machines,
	 * a comparison is enough cheaper than a divide to make a special test
	 * a win.  Since both inputs will be nonnegative, we need only test
	 * for a < b to discover whether a/b is 0.
	 * If your machine's division is fast enough, define FAST_DIVIDE.
	 */
#ifdef FAST_DIVIDE
#define DIVIDE_BY(a,b)	a /= b
#else
#define DIVIDE_BY(a,b)	if (a >= b) a /= b; else a = 0
#endif
	if (temp < 0) {
	  temp = -temp;
	  temp += qval>>1;	/* for rounding */
	  DIVIDE_BY(temp, qval);
	  temp = -temp;
	} else {
	  temp += qval>>1;	/* for rounding */
	  DIVIDE_BY(temp, qval);
	}
	output_ptr[i] = (JCOEF) temp;
      }
    }
  }
}